

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void set_mode_search_ctx(PC_TREE *pc_tree,int (*is_ctx_ready) [2],
                        PICK_MODE_CONTEXT **(*mode_srch_ctx) [2])

{
  PICK_MODE_CONTEXT **(*mode_srch_ctx_local) [2];
  int (*is_ctx_ready_local) [2];
  PC_TREE *pc_tree_local;
  
  mode_srch_ctx[1][0] = pc_tree->horizontal;
  mode_srch_ctx[3][0] = pc_tree->vertical;
  if ((*is_ctx_ready)[0] != 0) {
    (*mode_srch_ctx)[0] = &pc_tree->split[0]->none;
  }
  if (is_ctx_ready[2][0] != 0) {
    mode_srch_ctx[2][0] = &pc_tree->split[0]->none;
  }
  if ((*is_ctx_ready)[1] != 0) {
    (*mode_srch_ctx)[1] = &pc_tree->split[1]->none;
  }
  return;
}

Assistant:

static inline void set_mode_search_ctx(
    PC_TREE *pc_tree, const int is_ctx_ready[NUM_AB_PARTS][2],
    PICK_MODE_CONTEXT **mode_srch_ctx[NUM_AB_PARTS][2]) {
  mode_srch_ctx[HORZ_B][0] = &pc_tree->horizontal[0];
  mode_srch_ctx[VERT_B][0] = &pc_tree->vertical[0];

  if (is_ctx_ready[HORZ_A][0])
    mode_srch_ctx[HORZ_A][0] = &pc_tree->split[0]->none;

  if (is_ctx_ready[VERT_A][0])
    mode_srch_ctx[VERT_A][0] = &pc_tree->split[0]->none;

  if (is_ctx_ready[HORZ_A][1])
    mode_srch_ctx[HORZ_A][1] = &pc_tree->split[1]->none;
}